

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ArrayOrRandomizeMethodExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ArrayOrRandomizeMethodExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ParenExpressionListSyntax*&,slang::syntax::ConstraintBlockSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,
          ParenExpressionListSyntax **args_2,ConstraintBlockSyntax **args_3)

{
  Token with;
  ArrayOrRandomizeMethodExpressionSyntax *this_00;
  ConstraintBlockSyntax **args_local_3;
  ParenExpressionListSyntax **args_local_2;
  Token *args_local_1;
  ExpressionSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ArrayOrRandomizeMethodExpressionSyntax *)allocate(this,0x38,8);
  with.kind = args_1->kind;
  with._2_1_ = args_1->field_0x2;
  with.numFlags.raw = (args_1->numFlags).raw;
  with.rawLen = args_1->rawLen;
  with.info = args_1->info;
  slang::syntax::ArrayOrRandomizeMethodExpressionSyntax::ArrayOrRandomizeMethodExpressionSyntax
            (this_00,args,with,*args_2,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }